

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RTCFilterFunctionN p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  byte bVar39;
  byte bVar40;
  int iVar41;
  AABBNodeMB4D *node1;
  ulong uVar42;
  byte bVar43;
  undefined4 uVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [32];
  byte bVar47;
  uint uVar48;
  NodeRef root;
  long lVar49;
  ulong *puVar50;
  bool bVar51;
  byte bVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar91 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar92 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2ab9;
  Geometry *local_2ab8;
  BVH *local_2ab0;
  Intersectors *local_2aa8;
  RayQueryContext *local_2aa0;
  size_t local_2a98;
  RayK<8> *local_2a90;
  ulong local_2a88;
  undefined1 local_2a80 [32];
  ulong local_2a58;
  RTCFilterFunctionNArguments local_2a50;
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29e0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [8];
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  undefined4 uStack_28e4;
  undefined1 local_28e0 [8];
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  int local_28c0;
  int iStack_28bc;
  int iStack_28b8;
  int iStack_28b4;
  int iStack_28b0;
  int iStack_28ac;
  int iStack_28a8;
  int iStack_28a4;
  uint local_28a0;
  uint uStack_289c;
  uint uStack_2898;
  uint uStack_2894;
  uint uStack_2890;
  uint uStack_288c;
  uint uStack_2888;
  uint uStack_2884;
  uint local_2880;
  uint uStack_287c;
  uint uStack_2878;
  uint uStack_2874;
  uint uStack_2870;
  uint uStack_286c;
  uint uStack_2868;
  uint uStack_2864;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [8];
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  uint local_2660;
  uint uStack_265c;
  uint uStack_2658;
  uint uStack_2654;
  uint uStack_2650;
  uint uStack_264c;
  uint uStack_2648;
  uint uStack_2644;
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2ab0 = (BVH *)This->ptr;
  if ((local_2ab0->root).ptr != 8) {
    auVar55 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar84 = ZEXT816(0) << 0x40;
    uVar53 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar84),5);
    uVar45 = vpcmpeqd_avx512vl(auVar55,(undefined1  [32])valid_i->field_0);
    uVar53 = uVar53 & uVar45;
    bVar52 = (byte)uVar53;
    if (bVar52 != 0) {
      local_29e0._0_8_ = *(undefined8 *)ray;
      local_29e0._8_8_ = *(undefined8 *)(ray + 8);
      local_29e0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_29e0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_29e0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_29e0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_29e0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_29e0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_29e0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_29e0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_29e0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_29e0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2980 = *(undefined1 (*) [32])(ray + 0x80);
      local_2960 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2940 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar96 = ZEXT3264(auVar55);
      vandps_avx512vl(local_2980,auVar55);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar97 = ZEXT3264(auVar56);
      uVar45 = vcmpps_avx512vl(auVar55,auVar56,1);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar98 = ZEXT3264(auVar57);
      auVar58 = vdivps_avx512vl(auVar57,local_2980);
      vandps_avx512vl(local_2960,auVar55);
      uVar42 = vcmpps_avx512vl(auVar58,auVar56,1);
      auVar59 = vdivps_avx512vl(auVar57,local_2960);
      vandps_avx512vl(local_2940,auVar55);
      uVar16 = vcmpps_avx512vl(auVar59,auVar56,1);
      auVar55 = vdivps_avx512vl(auVar57,local_2940);
      bVar51 = (bool)((byte)uVar45 & 1);
      local_2920._0_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._0_4_;
      bVar51 = (bool)((byte)(uVar45 >> 1) & 1);
      local_2920._4_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._4_4_;
      bVar51 = (bool)((byte)(uVar45 >> 2) & 1);
      local_2920._8_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._8_4_;
      bVar51 = (bool)((byte)(uVar45 >> 3) & 1);
      local_2920._12_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._12_4_;
      bVar51 = (bool)((byte)(uVar45 >> 4) & 1);
      local_2920._16_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._16_4_;
      bVar51 = (bool)((byte)(uVar45 >> 5) & 1);
      local_2920._20_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._20_4_;
      bVar51 = (bool)((byte)(uVar45 >> 6) & 1);
      local_2920._24_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._24_4_;
      bVar51 = SUB81(uVar45 >> 7,0);
      local_2920._28_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar58._28_4_;
      bVar51 = (bool)((byte)uVar42 & 1);
      local_2900._0_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._0_4_;
      bVar51 = (bool)((byte)(uVar42 >> 1) & 1);
      local_2900._4_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._4_4_;
      bVar51 = (bool)((byte)(uVar42 >> 2) & 1);
      fStack_28f8 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._8_4_);
      bVar51 = (bool)((byte)(uVar42 >> 3) & 1);
      fStack_28f4 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._12_4_);
      bVar51 = (bool)((byte)(uVar42 >> 4) & 1);
      fStack_28f0 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._16_4_);
      bVar51 = (bool)((byte)(uVar42 >> 5) & 1);
      fStack_28ec = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._20_4_);
      bVar51 = (bool)((byte)(uVar42 >> 6) & 1);
      fStack_28e8 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._24_4_);
      bVar51 = SUB81(uVar42 >> 7,0);
      uStack_28e4 = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar59._28_4_;
      bVar51 = (bool)((byte)uVar16 & 1);
      local_28e0._0_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._0_4_;
      bVar51 = (bool)((byte)(uVar16 >> 1) & 1);
      local_28e0._4_4_ = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._4_4_;
      bVar51 = (bool)((byte)(uVar16 >> 2) & 1);
      fStack_28d8 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._8_4_);
      bVar51 = (bool)((byte)(uVar16 >> 3) & 1);
      fStack_28d4 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._12_4_);
      bVar51 = (bool)((byte)(uVar16 >> 4) & 1);
      fStack_28d0 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._16_4_);
      bVar51 = (bool)((byte)(uVar16 >> 5) & 1);
      fStack_28cc = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._20_4_);
      bVar51 = (bool)((byte)(uVar16 >> 6) & 1);
      fStack_28c8 = (float)((uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._24_4_);
      bVar51 = SUB81(uVar16 >> 7,0);
      uStack_28c4 = (uint)bVar51 * 0x5d5e0b6b | (uint)!bVar51 * auVar55._28_4_;
      uVar45 = vcmpps_avx512vl(local_2920,ZEXT1632(auVar84),1);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_28c0 = (uint)((byte)uVar45 & 1) * auVar55._0_4_;
      iStack_28bc = (uint)((byte)(uVar45 >> 1) & 1) * auVar55._4_4_;
      iStack_28b8 = (uint)((byte)(uVar45 >> 2) & 1) * auVar55._8_4_;
      iStack_28b4 = (uint)((byte)(uVar45 >> 3) & 1) * auVar55._12_4_;
      iStack_28b0 = (uint)((byte)(uVar45 >> 4) & 1) * auVar55._16_4_;
      iStack_28ac = (uint)((byte)(uVar45 >> 5) & 1) * auVar55._20_4_;
      iStack_28a8 = (uint)((byte)(uVar45 >> 6) & 1) * auVar55._24_4_;
      iStack_28a4 = (uint)(byte)(uVar45 >> 7) * auVar55._28_4_;
      auVar56 = ZEXT1632(auVar84);
      uVar45 = vcmpps_avx512vl(_local_2900,auVar56,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar51 = (bool)((byte)uVar45 & 1);
      local_28a0 = (uint)bVar51 * auVar55._0_4_ | (uint)!bVar51 * 0x30;
      bVar51 = (bool)((byte)(uVar45 >> 1) & 1);
      uStack_289c = (uint)bVar51 * auVar55._4_4_ | (uint)!bVar51 * 0x30;
      bVar51 = (bool)((byte)(uVar45 >> 2) & 1);
      uStack_2898 = (uint)bVar51 * auVar55._8_4_ | (uint)!bVar51 * 0x30;
      bVar51 = (bool)((byte)(uVar45 >> 3) & 1);
      uStack_2894 = (uint)bVar51 * auVar55._12_4_ | (uint)!bVar51 * 0x30;
      bVar51 = (bool)((byte)(uVar45 >> 4) & 1);
      uStack_2890 = (uint)bVar51 * auVar55._16_4_ | (uint)!bVar51 * 0x30;
      bVar51 = (bool)((byte)(uVar45 >> 5) & 1);
      uStack_288c = (uint)bVar51 * auVar55._20_4_ | (uint)!bVar51 * 0x30;
      bVar51 = (bool)((byte)(uVar45 >> 6) & 1);
      uStack_2888 = (uint)bVar51 * auVar55._24_4_ | (uint)!bVar51 * 0x30;
      bVar51 = SUB81(uVar45 >> 7,0);
      uStack_2884 = (uint)bVar51 * auVar55._28_4_ | (uint)!bVar51 * 0x30;
      uVar45 = vcmpps_avx512vl(_local_28e0,auVar56,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar51 = (bool)((byte)uVar45 & 1);
      local_2880 = (uint)bVar51 * auVar55._0_4_ | (uint)!bVar51 * 0x50;
      bVar51 = (bool)((byte)(uVar45 >> 1) & 1);
      uStack_287c = (uint)bVar51 * auVar55._4_4_ | (uint)!bVar51 * 0x50;
      bVar51 = (bool)((byte)(uVar45 >> 2) & 1);
      uStack_2878 = (uint)bVar51 * auVar55._8_4_ | (uint)!bVar51 * 0x50;
      bVar51 = (bool)((byte)(uVar45 >> 3) & 1);
      uStack_2874 = (uint)bVar51 * auVar55._12_4_ | (uint)!bVar51 * 0x50;
      bVar51 = (bool)((byte)(uVar45 >> 4) & 1);
      uStack_2870 = (uint)bVar51 * auVar55._16_4_ | (uint)!bVar51 * 0x50;
      bVar51 = (bool)((byte)(uVar45 >> 5) & 1);
      uStack_286c = (uint)bVar51 * auVar55._20_4_ | (uint)!bVar51 * 0x50;
      bVar51 = (bool)((byte)(uVar45 >> 6) & 1);
      uStack_2868 = (uint)bVar51 * auVar55._24_4_ | (uint)!bVar51 * 0x50;
      bVar51 = SUB81(uVar45 >> 7,0);
      uStack_2864 = (uint)bVar51 * auVar55._28_4_ | (uint)!bVar51 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar100 = ZEXT3264(local_1e80);
      auVar55 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar56);
      local_2860._0_4_ =
           (uint)(bVar52 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar52 & 1) * local_1e80._0_4_;
      bVar51 = (bool)((byte)(uVar53 >> 1) & 1);
      local_2860._4_4_ = (uint)bVar51 * auVar55._4_4_ | (uint)!bVar51 * local_1e80._4_4_;
      bVar51 = (bool)((byte)(uVar53 >> 2) & 1);
      local_2860._8_4_ = (uint)bVar51 * auVar55._8_4_ | (uint)!bVar51 * local_1e80._8_4_;
      bVar51 = (bool)((byte)(uVar53 >> 3) & 1);
      local_2860._12_4_ = (uint)bVar51 * auVar55._12_4_ | (uint)!bVar51 * local_1e80._12_4_;
      bVar51 = (bool)((byte)(uVar53 >> 4) & 1);
      local_2860._16_4_ = (uint)bVar51 * auVar55._16_4_ | (uint)!bVar51 * local_1e80._16_4_;
      bVar51 = (bool)((byte)(uVar53 >> 5) & 1);
      local_2860._20_4_ = (uint)bVar51 * auVar55._20_4_ | (uint)!bVar51 * local_1e80._20_4_;
      bVar51 = (bool)((byte)(uVar53 >> 6) & 1);
      local_2860._24_4_ = (uint)bVar51 * auVar55._24_4_ | (uint)!bVar51 * local_1e80._24_4_;
      bVar51 = SUB81(uVar53 >> 7,0);
      local_2860._28_4_ = (uint)bVar51 * auVar55._28_4_ | (uint)!bVar51 * local_1e80._28_4_;
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar99 = ZEXT3264(auVar55);
      auVar56 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar56);
      local_2840._0_4_ =
           (uint)(bVar52 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar55._0_4_;
      bVar51 = (bool)((byte)(uVar53 >> 1) & 1);
      local_2840._4_4_ = (uint)bVar51 * auVar56._4_4_ | (uint)!bVar51 * auVar55._4_4_;
      bVar51 = (bool)((byte)(uVar53 >> 2) & 1);
      local_2840._8_4_ = (uint)bVar51 * auVar56._8_4_ | (uint)!bVar51 * auVar55._8_4_;
      bVar51 = (bool)((byte)(uVar53 >> 3) & 1);
      local_2840._12_4_ = (uint)bVar51 * auVar56._12_4_ | (uint)!bVar51 * auVar55._12_4_;
      bVar51 = (bool)((byte)(uVar53 >> 4) & 1);
      local_2840._16_4_ = (uint)bVar51 * auVar56._16_4_ | (uint)!bVar51 * auVar55._16_4_;
      bVar51 = (bool)((byte)(uVar53 >> 5) & 1);
      local_2840._20_4_ = (uint)bVar51 * auVar56._20_4_ | (uint)!bVar51 * auVar55._20_4_;
      bVar51 = (bool)((byte)(uVar53 >> 6) & 1);
      local_2840._24_4_ = (uint)bVar51 * auVar56._24_4_ | (uint)!bVar51 * auVar55._24_4_;
      bVar51 = SUB81(uVar53 >> 7,0);
      local_2840._28_4_ = (uint)bVar51 * auVar56._28_4_ | (uint)!bVar51 * auVar55._28_4_;
      bVar47 = ~bVar52;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar53 = 5;
      }
      else {
        uVar53 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2a90 = ray + 0x100;
      puVar50 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar46 = (undefined1 (*) [32])local_1e40;
      local_2608 = (local_2ab0->root).ptr;
      local_1e60 = local_2860;
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar101 = ZEXT3264(auVar55);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar94 = ZEXT3264(auVar55);
      local_2aa8 = This;
      local_2aa0 = context;
      local_2a88 = uVar53;
LAB_007a5e9f:
      pauVar46 = pauVar46 + -1;
      root.ptr = puVar50[-1];
      puVar50 = puVar50 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_007a6916;
      auVar55 = *pauVar46;
      local_2ab8 = (Geometry *)vcmpps_avx512vl(auVar55,local_2840,1);
      if ((char)local_2ab8 == '\0') {
LAB_007a6927:
        iVar41 = 2;
      }
      else {
        uVar44 = SUB84(local_2ab8,0);
        iVar41 = 0;
        if ((uint)POPCOUNT(uVar44) <= uVar53) {
          do {
            local_2a80 = auVar55;
            local_2a98 = 0;
            for (uVar53 = (ulong)local_2ab8; (uVar53 & 1) == 0;
                uVar53 = uVar53 >> 1 | 0x8000000000000000) {
              local_2a98 = local_2a98 + 1;
            }
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar51 = occluded1(local_2aa8,local_2ab0,root,local_2a98,&local_2ab9,ray,
                               (TravRayK<8,_true> *)&local_29e0.field_0,local_2aa0);
            bVar39 = (byte)(1 << ((uint)local_2a98 & 0x1f));
            if (!bVar51) {
              bVar39 = 0;
            }
            bVar47 = bVar47 | bVar39;
            local_2ab8 = (Geometry *)((long)local_2ab8 - 1U & (ulong)local_2ab8);
            auVar55 = local_2a80;
          } while (local_2ab8 != (Geometry *)0x0);
          if (bVar47 == 0xff) {
            iVar41 = 3;
          }
          else {
            auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar51 = (bool)(bVar47 >> 1 & 1);
            bVar2 = (bool)(bVar47 >> 2 & 1);
            bVar3 = (bool)(bVar47 >> 3 & 1);
            bVar4 = (bool)(bVar47 >> 4 & 1);
            bVar5 = (bool)(bVar47 >> 5 & 1);
            bVar6 = (bool)(bVar47 >> 6 & 1);
            local_2840._4_4_ = (uint)bVar51 * auVar56._4_4_ | (uint)!bVar51 * local_2840._4_4_;
            local_2840._0_4_ =
                 (uint)(bVar47 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar47 & 1) * local_2840._0_4_;
            local_2840._8_4_ = (uint)bVar2 * auVar56._8_4_ | (uint)!bVar2 * local_2840._8_4_;
            local_2840._12_4_ = (uint)bVar3 * auVar56._12_4_ | (uint)!bVar3 * local_2840._12_4_;
            local_2840._16_4_ = (uint)bVar4 * auVar56._16_4_ | (uint)!bVar4 * local_2840._16_4_;
            local_2840._20_4_ = (uint)bVar5 * auVar56._20_4_ | (uint)!bVar5 * local_2840._20_4_;
            local_2840._24_4_ = (uint)bVar6 * auVar56._24_4_ | (uint)!bVar6 * local_2840._24_4_;
            local_2840._28_4_ =
                 (uint)(bVar47 >> 7) * auVar56._28_4_ |
                 (uint)!(bool)(bVar47 >> 7) * local_2840._28_4_;
            iVar41 = 2;
          }
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar96 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar97 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar98 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar99 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar100 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar101 = ZEXT3264(auVar56);
          auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar94 = ZEXT3264(auVar56);
        }
        auVar95 = ZEXT3264(auVar55);
        uVar53 = local_2a88;
        if ((uint)local_2a88 < (uint)POPCOUNT(uVar44)) {
          do {
            auVar55 = auVar95._0_32_;
            uVar48 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_007a6916;
              uVar19 = vcmpps_avx512vl(auVar55,local_2840,9);
              if ((char)uVar19 == '\0') goto LAB_007a6927;
              local_2a58 = (ulong)(uVar48 & 0xf) - 8;
              bVar39 = bVar47;
              if (local_2a58 == 0) goto LAB_007a68e8;
              bVar39 = ~bVar47;
              lVar49 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar53 = 0;
              goto LAB_007a6165;
            }
            uVar42 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar95 = ZEXT3264(auVar100._0_32_);
            uVar45 = 0;
            do {
              uVar16 = *(ulong *)(uVar42 + uVar45 * 8);
              if (uVar16 != 8) {
                uVar44 = *(undefined4 *)(uVar42 + 0x80 + uVar45 * 4);
                auVar85._4_4_ = uVar44;
                auVar85._0_4_ = uVar44;
                auVar85._8_4_ = uVar44;
                auVar85._12_4_ = uVar44;
                auVar85._16_4_ = uVar44;
                auVar85._20_4_ = uVar44;
                auVar85._24_4_ = uVar44;
                auVar85._28_4_ = uVar44;
                auVar56 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar44 = *(undefined4 *)(uVar42 + 0x20 + uVar45 * 4);
                auVar23._4_4_ = uVar44;
                auVar23._0_4_ = uVar44;
                auVar23._8_4_ = uVar44;
                auVar23._12_4_ = uVar44;
                auVar23._16_4_ = uVar44;
                auVar23._20_4_ = uVar44;
                auVar23._24_4_ = uVar44;
                auVar23._28_4_ = uVar44;
                auVar57 = vfmadd213ps_avx512vl(auVar85,auVar56,auVar23);
                uVar44 = *(undefined4 *)(uVar42 + 0xa0 + uVar45 * 4);
                auVar86._4_4_ = uVar44;
                auVar86._0_4_ = uVar44;
                auVar86._8_4_ = uVar44;
                auVar86._12_4_ = uVar44;
                auVar86._16_4_ = uVar44;
                auVar86._20_4_ = uVar44;
                auVar86._24_4_ = uVar44;
                auVar86._28_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar42 + 0x40 + uVar45 * 4);
                auVar24._4_4_ = uVar44;
                auVar24._0_4_ = uVar44;
                auVar24._8_4_ = uVar44;
                auVar24._12_4_ = uVar44;
                auVar24._16_4_ = uVar44;
                auVar24._20_4_ = uVar44;
                auVar24._24_4_ = uVar44;
                auVar24._28_4_ = uVar44;
                auVar58 = vfmadd213ps_avx512vl(auVar86,auVar56,auVar24);
                uVar44 = *(undefined4 *)(uVar42 + 0xc0 + uVar45 * 4);
                auVar87._4_4_ = uVar44;
                auVar87._0_4_ = uVar44;
                auVar87._8_4_ = uVar44;
                auVar87._12_4_ = uVar44;
                auVar87._16_4_ = uVar44;
                auVar87._20_4_ = uVar44;
                auVar87._24_4_ = uVar44;
                auVar87._28_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar42 + 0x60 + uVar45 * 4);
                auVar25._4_4_ = uVar44;
                auVar25._0_4_ = uVar44;
                auVar25._8_4_ = uVar44;
                auVar25._12_4_ = uVar44;
                auVar25._16_4_ = uVar44;
                auVar25._20_4_ = uVar44;
                auVar25._24_4_ = uVar44;
                auVar25._28_4_ = uVar44;
                auVar59 = vfmadd213ps_avx512vl(auVar87,auVar56,auVar25);
                uVar44 = *(undefined4 *)(uVar42 + 0x90 + uVar45 * 4);
                auVar88._4_4_ = uVar44;
                auVar88._0_4_ = uVar44;
                auVar88._8_4_ = uVar44;
                auVar88._12_4_ = uVar44;
                auVar88._16_4_ = uVar44;
                auVar88._20_4_ = uVar44;
                auVar88._24_4_ = uVar44;
                auVar88._28_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar42 + 0x30 + uVar45 * 4);
                auVar26._4_4_ = uVar44;
                auVar26._0_4_ = uVar44;
                auVar26._8_4_ = uVar44;
                auVar26._12_4_ = uVar44;
                auVar26._16_4_ = uVar44;
                auVar26._20_4_ = uVar44;
                auVar26._24_4_ = uVar44;
                auVar26._28_4_ = uVar44;
                auVar60 = vfmadd213ps_avx512vl(auVar88,auVar56,auVar26);
                uVar44 = *(undefined4 *)(uVar42 + 0xb0 + uVar45 * 4);
                auVar89._4_4_ = uVar44;
                auVar89._0_4_ = uVar44;
                auVar89._8_4_ = uVar44;
                auVar89._12_4_ = uVar44;
                auVar89._16_4_ = uVar44;
                auVar89._20_4_ = uVar44;
                auVar89._24_4_ = uVar44;
                auVar89._28_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar42 + 0x50 + uVar45 * 4);
                auVar27._4_4_ = uVar44;
                auVar27._0_4_ = uVar44;
                auVar27._8_4_ = uVar44;
                auVar27._12_4_ = uVar44;
                auVar27._16_4_ = uVar44;
                auVar27._20_4_ = uVar44;
                auVar27._24_4_ = uVar44;
                auVar27._28_4_ = uVar44;
                auVar61 = vfmadd213ps_avx512vl(auVar89,auVar56,auVar27);
                uVar44 = *(undefined4 *)(uVar42 + 0xd0 + uVar45 * 4);
                auVar90._4_4_ = uVar44;
                auVar90._0_4_ = uVar44;
                auVar90._8_4_ = uVar44;
                auVar90._12_4_ = uVar44;
                auVar90._16_4_ = uVar44;
                auVar90._20_4_ = uVar44;
                auVar90._24_4_ = uVar44;
                auVar90._28_4_ = uVar44;
                uVar44 = *(undefined4 *)(uVar42 + 0x70 + uVar45 * 4);
                auVar28._4_4_ = uVar44;
                auVar28._0_4_ = uVar44;
                auVar28._8_4_ = uVar44;
                auVar28._12_4_ = uVar44;
                auVar28._16_4_ = uVar44;
                auVar28._20_4_ = uVar44;
                auVar28._24_4_ = uVar44;
                auVar28._28_4_ = uVar44;
                auVar62 = vfmadd213ps_avx512vl(auVar90,auVar56,auVar28);
                auVar36._8_8_ = local_29e0._8_8_;
                auVar36._0_8_ = local_29e0._0_8_;
                auVar36._16_8_ = local_29e0._16_8_;
                auVar36._24_8_ = local_29e0._24_8_;
                auVar37._8_8_ = local_29e0._40_8_;
                auVar37._0_8_ = local_29e0._32_8_;
                auVar37._16_8_ = local_29e0._48_8_;
                auVar37._24_8_ = local_29e0._56_8_;
                auVar38._8_8_ = local_29e0._72_8_;
                auVar38._0_8_ = local_29e0._64_8_;
                auVar38._16_8_ = local_29e0._80_8_;
                auVar38._24_8_ = local_29e0._88_8_;
                auVar57 = vsubps_avx(auVar57,auVar36);
                auVar91._0_4_ = local_2920._0_4_ * auVar57._0_4_;
                auVar91._4_4_ = local_2920._4_4_ * auVar57._4_4_;
                auVar91._8_4_ = local_2920._8_4_ * auVar57._8_4_;
                auVar91._12_4_ = local_2920._12_4_ * auVar57._12_4_;
                auVar91._16_4_ = local_2920._16_4_ * auVar57._16_4_;
                auVar91._20_4_ = local_2920._20_4_ * auVar57._20_4_;
                auVar91._28_36_ = in_ZMM13._28_36_;
                auVar91._24_4_ = local_2920._24_4_ * auVar57._24_4_;
                auVar70 = auVar91._0_32_;
                in_ZMM13 = ZEXT3264(auVar70);
                auVar57 = vsubps_avx(auVar58,auVar37);
                auVar92._0_4_ = auVar57._0_4_ * (float)local_2900._0_4_;
                auVar92._4_4_ = auVar57._4_4_ * (float)local_2900._4_4_;
                auVar92._8_4_ = auVar57._8_4_ * fStack_28f8;
                auVar92._12_4_ = auVar57._12_4_ * fStack_28f4;
                auVar92._16_4_ = auVar57._16_4_ * fStack_28f0;
                auVar92._20_4_ = auVar57._20_4_ * fStack_28ec;
                auVar92._28_36_ = in_ZMM14._28_36_;
                auVar92._24_4_ = auVar57._24_4_ * fStack_28e8;
                auVar71 = auVar92._0_32_;
                in_ZMM14 = ZEXT3264(auVar71);
                auVar57 = vsubps_avx(auVar59,auVar38);
                auVar93._0_4_ = auVar57._0_4_ * (float)local_28e0._0_4_;
                auVar93._4_4_ = auVar57._4_4_ * (float)local_28e0._4_4_;
                auVar93._8_4_ = auVar57._8_4_ * fStack_28d8;
                auVar93._12_4_ = auVar57._12_4_ * fStack_28d4;
                auVar93._16_4_ = auVar57._16_4_ * fStack_28d0;
                auVar93._20_4_ = auVar57._20_4_ * fStack_28cc;
                auVar93._28_36_ = in_ZMM15._28_36_;
                auVar93._24_4_ = auVar57._24_4_ * fStack_28c8;
                auVar63 = auVar93._0_32_;
                in_ZMM15 = ZEXT3264(auVar63);
                auVar57 = vsubps_avx(auVar60,auVar36);
                auVar31._4_4_ = local_2920._4_4_ * auVar57._4_4_;
                auVar31._0_4_ = local_2920._0_4_ * auVar57._0_4_;
                auVar31._8_4_ = local_2920._8_4_ * auVar57._8_4_;
                auVar31._12_4_ = local_2920._12_4_ * auVar57._12_4_;
                auVar31._16_4_ = local_2920._16_4_ * auVar57._16_4_;
                auVar31._20_4_ = local_2920._20_4_ * auVar57._20_4_;
                auVar31._24_4_ = local_2920._24_4_ * auVar57._24_4_;
                auVar31._28_4_ = auVar60._28_4_;
                auVar57 = vsubps_avx(auVar61,auVar37);
                auVar32._4_4_ = auVar57._4_4_ * (float)local_2900._4_4_;
                auVar32._0_4_ = auVar57._0_4_ * (float)local_2900._0_4_;
                auVar32._8_4_ = auVar57._8_4_ * fStack_28f8;
                auVar32._12_4_ = auVar57._12_4_ * fStack_28f4;
                auVar32._16_4_ = auVar57._16_4_ * fStack_28f0;
                auVar32._20_4_ = auVar57._20_4_ * fStack_28ec;
                auVar32._24_4_ = auVar57._24_4_ * fStack_28e8;
                auVar32._28_4_ = uStack_28e4;
                auVar57 = vsubps_avx(auVar62,auVar38);
                auVar33._4_4_ = auVar57._4_4_ * (float)local_28e0._4_4_;
                auVar33._0_4_ = auVar57._0_4_ * (float)local_28e0._0_4_;
                auVar33._8_4_ = auVar57._8_4_ * fStack_28d8;
                auVar33._12_4_ = auVar57._12_4_ * fStack_28d4;
                auVar33._16_4_ = auVar57._16_4_ * fStack_28d0;
                auVar33._20_4_ = auVar57._20_4_ * fStack_28cc;
                auVar33._24_4_ = auVar57._24_4_ * fStack_28c8;
                auVar33._28_4_ = uStack_28c4;
                auVar57 = vpminsd_avx2(auVar70,auVar31);
                auVar58 = vpminsd_avx2(auVar71,auVar32);
                auVar57 = vpmaxsd_avx2(auVar57,auVar58);
                auVar58 = vpminsd_avx2(auVar63,auVar33);
                auVar57 = vpmaxsd_avx2(auVar57,auVar58);
                auVar59 = vmulps_avx512vl(auVar57,auVar101._0_32_);
                auVar57 = vpmaxsd_avx2(auVar70,auVar31);
                auVar58 = vpmaxsd_avx2(auVar71,auVar32);
                auVar58 = vpminsd_avx2(auVar57,auVar58);
                auVar57 = vpmaxsd_avx2(auVar63,auVar33);
                auVar57 = vpminsd_avx2(auVar58,auVar57);
                auVar58 = vmulps_avx512vl(auVar57,auVar94._0_32_);
                auVar57 = vpmaxsd_avx2(auVar59,local_2860);
                auVar58 = vpminsd_avx2(auVar58,local_2840);
                uVar54 = vcmpps_avx512vl(auVar57,auVar58,2);
                if ((uVar48 & 7) == 6) {
                  uVar44 = *(undefined4 *)(uVar42 + 0xe0 + uVar45 * 4);
                  auVar29._4_4_ = uVar44;
                  auVar29._0_4_ = uVar44;
                  auVar29._8_4_ = uVar44;
                  auVar29._12_4_ = uVar44;
                  auVar29._16_4_ = uVar44;
                  auVar29._20_4_ = uVar44;
                  auVar29._24_4_ = uVar44;
                  auVar29._28_4_ = uVar44;
                  uVar17 = vcmpps_avx512vl(auVar56,auVar29,0xd);
                  uVar44 = *(undefined4 *)(uVar42 + 0xf0 + uVar45 * 4);
                  auVar30._4_4_ = uVar44;
                  auVar30._0_4_ = uVar44;
                  auVar30._8_4_ = uVar44;
                  auVar30._12_4_ = uVar44;
                  auVar30._16_4_ = uVar44;
                  auVar30._20_4_ = uVar44;
                  auVar30._24_4_ = uVar44;
                  auVar30._28_4_ = uVar44;
                  uVar18 = vcmpps_avx512vl(auVar56,auVar30,1);
                  uVar54 = uVar54 & uVar17 & uVar18;
                }
                uVar17 = vcmpps_avx512vl(local_2840,auVar55,6);
                uVar54 = uVar54 & uVar17;
                if ((byte)uVar54 != 0) {
                  auVar57 = vblendmps_avx512vl(auVar100._0_32_,auVar59);
                  bVar51 = (bool)((byte)uVar54 & 1);
                  bVar2 = (bool)((byte)(uVar54 >> 1) & 1);
                  bVar3 = (bool)((byte)(uVar54 >> 2) & 1);
                  bVar4 = (bool)((byte)(uVar54 >> 3) & 1);
                  bVar5 = (bool)((byte)(uVar54 >> 4) & 1);
                  bVar6 = (bool)((byte)(uVar54 >> 5) & 1);
                  bVar7 = (bool)((byte)(uVar54 >> 6) & 1);
                  bVar8 = SUB81(uVar54 >> 7,0);
                  if (root.ptr != 8) {
                    *puVar50 = root.ptr;
                    puVar50 = puVar50 + 1;
                    *pauVar46 = auVar95._0_32_;
                    pauVar46 = pauVar46 + 1;
                  }
                  auVar95 = ZEXT3264(CONCAT428((uint)bVar8 * auVar57._28_4_ |
                                               (uint)!bVar8 * auVar56._28_4_,
                                               CONCAT424((uint)bVar7 * auVar57._24_4_ |
                                                         (uint)!bVar7 * auVar56._24_4_,
                                                         CONCAT420((uint)bVar6 * auVar57._20_4_ |
                                                                   (uint)!bVar6 * auVar56._20_4_,
                                                                   CONCAT416((uint)bVar5 *
                                                                             auVar57._16_4_ |
                                                                             (uint)!bVar5 *
                                                                             auVar56._16_4_,
                                                                             CONCAT412((uint)bVar4 *
                                                                                       auVar57.
                                                  _12_4_ | (uint)!bVar4 * auVar56._12_4_,
                                                  CONCAT48((uint)bVar3 * auVar57._8_4_ |
                                                           (uint)!bVar3 * auVar56._8_4_,
                                                           CONCAT44((uint)bVar2 * auVar57._4_4_ |
                                                                    (uint)!bVar2 * auVar56._4_4_,
                                                                    (uint)bVar51 * auVar57._0_4_ |
                                                                    (uint)!bVar51 * auVar56._0_4_)))
                                                  )))));
                  root.ptr = uVar16;
                }
              }
            } while ((uVar16 != 8) && (bVar51 = uVar45 < 3, uVar45 = uVar45 + 1, bVar51));
            iVar41 = 0;
            if (root.ptr == 8) {
LAB_007a6117:
              bVar51 = false;
              iVar41 = 4;
            }
            else {
              uVar19 = vcmpps_avx512vl(auVar95._0_32_,local_2840,9);
              bVar51 = true;
              if ((uint)POPCOUNT((int)uVar19) <= (uint)local_2a88) {
                *puVar50 = root.ptr;
                puVar50 = puVar50 + 1;
                *pauVar46 = auVar95._0_32_;
                pauVar46 = pauVar46 + 1;
                goto LAB_007a6117;
              }
            }
          } while (bVar51);
        }
      }
      goto LAB_007a6919;
    }
  }
  return;
  while( true ) {
    uVar53 = uVar53 + 1;
    lVar49 = lVar49 + 0x140;
    if (local_2a58 <= uVar53) break;
LAB_007a6165:
    local_2a80._0_8_ = uVar53;
    uVar45 = 0;
    bVar40 = bVar39;
    while (uVar42 = (ulong)*(uint *)(lVar49 + -0x10 + uVar45 * 4), uVar42 != 0xffffffff) {
      auVar55 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar44 = *(undefined4 *)(lVar49 + -0xa0 + uVar45 * 4);
      auVar65._4_4_ = uVar44;
      auVar65._0_4_ = uVar44;
      auVar65._8_4_ = uVar44;
      auVar65._12_4_ = uVar44;
      auVar65._16_4_ = uVar44;
      auVar65._20_4_ = uVar44;
      auVar65._24_4_ = uVar44;
      auVar65._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x90 + uVar45 * 4);
      auVar66._4_4_ = uVar44;
      auVar66._0_4_ = uVar44;
      auVar66._8_4_ = uVar44;
      auVar66._12_4_ = uVar44;
      auVar66._16_4_ = uVar44;
      auVar66._20_4_ = uVar44;
      auVar66._24_4_ = uVar44;
      auVar66._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x80 + uVar45 * 4);
      auVar67._4_4_ = uVar44;
      auVar67._0_4_ = uVar44;
      auVar67._8_4_ = uVar44;
      auVar67._12_4_ = uVar44;
      auVar67._16_4_ = uVar44;
      auVar67._20_4_ = uVar44;
      auVar67._24_4_ = uVar44;
      auVar67._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x130 + uVar45 * 4);
      auVar56._4_4_ = uVar44;
      auVar56._0_4_ = uVar44;
      auVar56._8_4_ = uVar44;
      auVar56._12_4_ = uVar44;
      auVar56._16_4_ = uVar44;
      auVar56._20_4_ = uVar44;
      auVar56._24_4_ = uVar44;
      auVar56._28_4_ = uVar44;
      auVar63 = vfmadd213ps_avx512vl(auVar65,auVar55,auVar56);
      uVar44 = *(undefined4 *)(lVar49 + -0x120 + uVar45 * 4);
      auVar57._4_4_ = uVar44;
      auVar57._0_4_ = uVar44;
      auVar57._8_4_ = uVar44;
      auVar57._12_4_ = uVar44;
      auVar57._16_4_ = uVar44;
      auVar57._20_4_ = uVar44;
      auVar57._24_4_ = uVar44;
      auVar57._28_4_ = uVar44;
      auVar64 = vfmadd213ps_avx512vl(auVar66,auVar55,auVar57);
      uVar44 = *(undefined4 *)(lVar49 + -0x110 + uVar45 * 4);
      auVar58._4_4_ = uVar44;
      auVar58._0_4_ = uVar44;
      auVar58._8_4_ = uVar44;
      auVar58._12_4_ = uVar44;
      auVar58._16_4_ = uVar44;
      auVar58._20_4_ = uVar44;
      auVar58._24_4_ = uVar44;
      auVar58._28_4_ = uVar44;
      auVar65 = vfmadd213ps_avx512vl(auVar67,auVar55,auVar58);
      uVar44 = *(undefined4 *)(lVar49 + -0x70 + uVar45 * 4);
      auVar68._4_4_ = uVar44;
      auVar68._0_4_ = uVar44;
      auVar68._8_4_ = uVar44;
      auVar68._12_4_ = uVar44;
      auVar68._16_4_ = uVar44;
      auVar68._20_4_ = uVar44;
      auVar68._24_4_ = uVar44;
      auVar68._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x60 + uVar45 * 4);
      auVar69._4_4_ = uVar44;
      auVar69._0_4_ = uVar44;
      auVar69._8_4_ = uVar44;
      auVar69._12_4_ = uVar44;
      auVar69._16_4_ = uVar44;
      auVar69._20_4_ = uVar44;
      auVar69._24_4_ = uVar44;
      auVar69._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x50 + uVar45 * 4);
      auVar72._4_4_ = uVar44;
      auVar72._0_4_ = uVar44;
      auVar72._8_4_ = uVar44;
      auVar72._12_4_ = uVar44;
      auVar72._16_4_ = uVar44;
      auVar72._20_4_ = uVar44;
      auVar72._24_4_ = uVar44;
      auVar72._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x100 + uVar45 * 4);
      auVar59._4_4_ = uVar44;
      auVar59._0_4_ = uVar44;
      auVar59._8_4_ = uVar44;
      auVar59._12_4_ = uVar44;
      auVar59._16_4_ = uVar44;
      auVar59._20_4_ = uVar44;
      auVar59._24_4_ = uVar44;
      auVar59._28_4_ = uVar44;
      auVar66 = vfmadd213ps_avx512vl(auVar68,auVar55,auVar59);
      uVar44 = *(undefined4 *)(lVar49 + -0xf0 + uVar45 * 4);
      auVar60._4_4_ = uVar44;
      auVar60._0_4_ = uVar44;
      auVar60._8_4_ = uVar44;
      auVar60._12_4_ = uVar44;
      auVar60._16_4_ = uVar44;
      auVar60._20_4_ = uVar44;
      auVar60._24_4_ = uVar44;
      auVar60._28_4_ = uVar44;
      auVar67 = vfmadd213ps_avx512vl(auVar69,auVar55,auVar60);
      uVar44 = *(undefined4 *)(lVar49 + -0xe0 + uVar45 * 4);
      auVar61._4_4_ = uVar44;
      auVar61._0_4_ = uVar44;
      auVar61._8_4_ = uVar44;
      auVar61._12_4_ = uVar44;
      auVar61._16_4_ = uVar44;
      auVar61._20_4_ = uVar44;
      auVar61._24_4_ = uVar44;
      auVar61._28_4_ = uVar44;
      auVar68 = vfmadd213ps_avx512vl(auVar72,auVar55,auVar61);
      uVar44 = *(undefined4 *)(lVar49 + -0x40 + uVar45 * 4);
      auVar73._4_4_ = uVar44;
      auVar73._0_4_ = uVar44;
      auVar73._8_4_ = uVar44;
      auVar73._12_4_ = uVar44;
      auVar73._16_4_ = uVar44;
      auVar73._20_4_ = uVar44;
      auVar73._24_4_ = uVar44;
      auVar73._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x30 + uVar45 * 4);
      auVar74._4_4_ = uVar44;
      auVar74._0_4_ = uVar44;
      auVar74._8_4_ = uVar44;
      auVar74._12_4_ = uVar44;
      auVar74._16_4_ = uVar44;
      auVar74._20_4_ = uVar44;
      auVar74._24_4_ = uVar44;
      auVar74._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0x20 + uVar45 * 4);
      auVar75._4_4_ = uVar44;
      auVar75._0_4_ = uVar44;
      auVar75._8_4_ = uVar44;
      auVar75._12_4_ = uVar44;
      auVar75._16_4_ = uVar44;
      auVar75._20_4_ = uVar44;
      auVar75._24_4_ = uVar44;
      auVar75._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar49 + -0xd0 + uVar45 * 4);
      auVar62._4_4_ = uVar44;
      auVar62._0_4_ = uVar44;
      auVar62._8_4_ = uVar44;
      auVar62._12_4_ = uVar44;
      auVar62._16_4_ = uVar44;
      auVar62._20_4_ = uVar44;
      auVar62._24_4_ = uVar44;
      auVar62._28_4_ = uVar44;
      auVar69 = vfmadd213ps_avx512vl(auVar73,auVar55,auVar62);
      uVar44 = *(undefined4 *)(lVar49 + -0xc0 + uVar45 * 4);
      auVar70._4_4_ = uVar44;
      auVar70._0_4_ = uVar44;
      auVar70._8_4_ = uVar44;
      auVar70._12_4_ = uVar44;
      auVar70._16_4_ = uVar44;
      auVar70._20_4_ = uVar44;
      auVar70._24_4_ = uVar44;
      auVar70._28_4_ = uVar44;
      auVar70 = vfmadd213ps_avx512vl(auVar74,auVar55,auVar70);
      uVar44 = *(undefined4 *)(lVar49 + -0xb0 + uVar45 * 4);
      auVar71._4_4_ = uVar44;
      auVar71._0_4_ = uVar44;
      auVar71._8_4_ = uVar44;
      auVar71._12_4_ = uVar44;
      auVar71._16_4_ = uVar44;
      auVar71._20_4_ = uVar44;
      auVar71._24_4_ = uVar44;
      auVar71._28_4_ = uVar44;
      auVar71 = vfmadd213ps_avx512vl(auVar75,auVar55,auVar71);
      auVar55 = *(undefined1 (*) [32])ray;
      auVar56 = *(undefined1 (*) [32])(ray + 0x20);
      auVar57 = *(undefined1 (*) [32])(ray + 0x40);
      auVar58 = *(undefined1 (*) [32])(ray + 0x80);
      auVar59 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar60 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar61 = vsubps_avx(auVar63,auVar55);
      auVar62 = vsubps_avx(auVar64,auVar56);
      auVar65 = vsubps_avx512vl(auVar65,auVar57);
      auVar66 = vsubps_avx512vl(auVar66,auVar55);
      auVar67 = vsubps_avx512vl(auVar67,auVar56);
      auVar68 = vsubps_avx512vl(auVar68,auVar57);
      auVar55 = vsubps_avx512vl(auVar69,auVar55);
      auVar56 = vsubps_avx512vl(auVar70,auVar56);
      auVar57 = vsubps_avx512vl(auVar71,auVar57);
      auVar70 = vsubps_avx512vl(auVar55,auVar61);
      auVar71 = vsubps_avx512vl(auVar56,auVar62);
      auVar69 = vsubps_avx512vl(auVar57,auVar65);
      auVar72 = vsubps_avx512vl(auVar61,auVar66);
      in_ZMM14 = ZEXT3264(auVar72);
      auVar73 = vsubps_avx512vl(auVar62,auVar67);
      auVar74 = vsubps_avx512vl(auVar65,auVar68);
      in_ZMM15 = ZEXT3264(auVar74);
      auVar75 = vsubps_avx512vl(auVar66,auVar55);
      auVar76 = vsubps_avx512vl(auVar67,auVar56);
      auVar77 = vsubps_avx512vl(auVar68,auVar57);
      auVar64 = vaddps_avx512vl(auVar55,auVar61);
      auVar78 = vaddps_avx512vl(auVar56,auVar62);
      auVar63 = vaddps_avx512vl(auVar57,auVar65);
      auVar79 = vmulps_avx512vl(auVar78,auVar69);
      auVar79 = vfmsub231ps_avx512vl(auVar79,auVar71,auVar63);
      auVar63 = vmulps_avx512vl(auVar63,auVar70);
      auVar80 = vfmsub231ps_avx512vl(auVar63,auVar69,auVar64);
      auVar63._4_4_ = auVar64._4_4_ * auVar71._4_4_;
      auVar63._0_4_ = auVar64._0_4_ * auVar71._0_4_;
      auVar63._8_4_ = auVar64._8_4_ * auVar71._8_4_;
      auVar63._12_4_ = auVar64._12_4_ * auVar71._12_4_;
      auVar63._16_4_ = auVar64._16_4_ * auVar71._16_4_;
      auVar63._20_4_ = auVar64._20_4_ * auVar71._20_4_;
      auVar63._24_4_ = auVar64._24_4_ * auVar71._24_4_;
      auVar63._28_4_ = auVar64._28_4_;
      auVar84 = vfmsub231ps_fma(auVar63,auVar70,auVar78);
      fVar9 = auVar60._0_4_;
      auVar78._0_4_ = auVar84._0_4_ * fVar9;
      fVar10 = auVar60._4_4_;
      auVar78._4_4_ = auVar84._4_4_ * fVar10;
      fVar11 = auVar60._8_4_;
      auVar78._8_4_ = auVar84._8_4_ * fVar11;
      fVar12 = auVar60._12_4_;
      auVar78._12_4_ = auVar84._12_4_ * fVar12;
      fVar13 = auVar60._16_4_;
      auVar78._16_4_ = fVar13 * 0.0;
      fVar14 = auVar60._20_4_;
      auVar78._20_4_ = fVar14 * 0.0;
      fVar15 = auVar60._24_4_;
      auVar78._24_4_ = fVar15 * 0.0;
      auVar78._28_4_ = 0;
      auVar63 = vfmadd231ps_avx512vl(auVar78,auVar59,auVar80);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar58,auVar79);
      auVar64 = vaddps_avx512vl(auVar61,auVar66);
      auVar78 = vaddps_avx512vl(auVar62,auVar67);
      auVar79 = vaddps_avx512vl(auVar65,auVar68);
      auVar80 = vmulps_avx512vl(auVar78,auVar74);
      auVar80 = vfmsub231ps_avx512vl(auVar80,auVar73,auVar79);
      auVar79 = vmulps_avx512vl(auVar79,auVar72);
      auVar79 = vfmsub231ps_avx512vl(auVar79,auVar74,auVar64);
      auVar64 = vmulps_avx512vl(auVar64,auVar73);
      auVar78 = vfmsub231ps_avx512vl(auVar64,auVar72,auVar78);
      auVar64._4_4_ = auVar78._4_4_ * fVar10;
      auVar64._0_4_ = auVar78._0_4_ * fVar9;
      auVar64._8_4_ = auVar78._8_4_ * fVar11;
      auVar64._12_4_ = auVar78._12_4_ * fVar12;
      auVar64._16_4_ = auVar78._16_4_ * fVar13;
      auVar64._20_4_ = auVar78._20_4_ * fVar14;
      auVar64._24_4_ = auVar78._24_4_ * fVar15;
      auVar64._28_4_ = auVar78._28_4_;
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar59,auVar79);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar58,auVar80);
      in_ZMM13 = ZEXT3264(auVar64);
      auVar55 = vaddps_avx512vl(auVar66,auVar55);
      auVar56 = vaddps_avx512vl(auVar67,auVar56);
      auVar57 = vaddps_avx512vl(auVar68,auVar57);
      auVar66 = vmulps_avx512vl(auVar56,auVar77);
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar76,auVar57);
      auVar57 = vmulps_avx512vl(auVar57,auVar75);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar77,auVar55);
      auVar55 = vmulps_avx512vl(auVar55,auVar76);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar75,auVar56);
      auVar55 = vmulps_avx512vl(auVar55,auVar60);
      auVar55 = vfmadd231ps_avx512vl(auVar55,auVar59,auVar57);
      auVar56 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar66);
      auVar55 = vaddps_avx512vl(auVar63,auVar64);
      auVar57 = vaddps_avx512vl(auVar56,auVar55);
      auVar68 = auVar96._0_32_;
      vandps_avx512vl(auVar57,auVar68);
      auVar55._8_4_ = 0x34000000;
      auVar55._0_8_ = 0x3400000034000000;
      auVar55._12_4_ = 0x34000000;
      auVar55._16_4_ = 0x34000000;
      auVar55._20_4_ = 0x34000000;
      auVar55._24_4_ = 0x34000000;
      auVar55._28_4_ = 0x34000000;
      auVar55 = vmulps_avx512vl(auVar57,auVar55);
      auVar66 = vminps_avx512vl(auVar63,auVar64);
      auVar66 = vminps_avx512vl(auVar66,auVar56);
      auVar67 = vxorps_avx512vl(auVar55,auVar78);
      uVar19 = vcmpps_avx512vl(auVar66,auVar67,5);
      auVar66 = vmaxps_avx512vl(auVar63,auVar64);
      auVar56 = vmaxps_avx512vl(auVar66,auVar56);
      uVar20 = vcmpps_avx512vl(auVar56,auVar55,2);
      local_2a98 = CONCAT71(local_2a98._1_7_,bVar40);
      bVar43 = ((byte)uVar19 | (byte)uVar20) & bVar40;
      auVar55 = auVar98._0_32_;
      if (bVar43 != 0) {
        auVar56 = vmulps_avx512vl(auVar73,auVar69);
        auVar66 = vmulps_avx512vl(auVar70,auVar74);
        auVar67 = vmulps_avx512vl(auVar72,auVar71);
        auVar79 = vmulps_avx512vl(auVar76,auVar74);
        auVar80 = vmulps_avx512vl(auVar72,auVar77);
        auVar81 = vmulps_avx512vl(auVar75,auVar73);
        auVar71 = vfmsub213ps_avx512vl(auVar71,auVar74,auVar56);
        auVar69 = vfmsub213ps_avx512vl(auVar69,auVar72,auVar66);
        auVar70 = vfmsub213ps_avx512vl(auVar70,auVar73,auVar67);
        auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar79);
        auVar74 = vfmsub213ps_avx512vl(auVar75,auVar74,auVar80);
        auVar72 = vfmsub213ps_avx512vl(auVar76,auVar72,auVar81);
        vandps_avx512vl(auVar56,auVar68);
        vandps_avx512vl(auVar79,auVar68);
        uVar16 = vcmpps_avx512vl(auVar72,auVar72,1);
        vandps_avx512vl(auVar66,auVar68);
        vandps_avx512vl(auVar80,auVar68);
        uVar54 = vcmpps_avx512vl(auVar72,auVar72,1);
        vandps_avx512vl(auVar67,auVar68);
        in_ZMM14 = ZEXT3264(auVar72);
        vandps_avx512vl(auVar81,auVar68);
        in_ZMM15 = ZEXT3264(auVar72);
        uVar17 = vcmpps_avx512vl(auVar72,auVar72,1);
        bVar51 = (bool)((byte)uVar16 & 1);
        auVar77._0_4_ = (uint)bVar51 * auVar71._0_4_ | (uint)!bVar51 * auVar73._0_4_;
        bVar51 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar77._4_4_ = (uint)bVar51 * auVar71._4_4_ | (uint)!bVar51 * auVar73._4_4_;
        bVar51 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar77._8_4_ = (uint)bVar51 * auVar71._8_4_ | (uint)!bVar51 * auVar73._8_4_;
        bVar51 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar77._12_4_ = (uint)bVar51 * auVar71._12_4_ | (uint)!bVar51 * auVar73._12_4_;
        bVar51 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar77._16_4_ = (uint)bVar51 * auVar71._16_4_ | (uint)!bVar51 * auVar73._16_4_;
        bVar51 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar77._20_4_ = (uint)bVar51 * auVar71._20_4_ | (uint)!bVar51 * auVar73._20_4_;
        bVar51 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar77._24_4_ = (uint)bVar51 * auVar71._24_4_ | (uint)!bVar51 * auVar73._24_4_;
        bVar51 = SUB81(uVar16 >> 7,0);
        auVar77._28_4_ = (uint)bVar51 * auVar71._28_4_ | (uint)!bVar51 * auVar73._28_4_;
        bVar51 = (bool)((byte)uVar54 & 1);
        auVar79._0_4_ = (uint)bVar51 * auVar69._0_4_ | (uint)!bVar51 * auVar74._0_4_;
        bVar51 = (bool)((byte)(uVar54 >> 1) & 1);
        auVar79._4_4_ = (uint)bVar51 * auVar69._4_4_ | (uint)!bVar51 * auVar74._4_4_;
        bVar51 = (bool)((byte)(uVar54 >> 2) & 1);
        auVar79._8_4_ = (uint)bVar51 * auVar69._8_4_ | (uint)!bVar51 * auVar74._8_4_;
        bVar51 = (bool)((byte)(uVar54 >> 3) & 1);
        auVar79._12_4_ = (uint)bVar51 * auVar69._12_4_ | (uint)!bVar51 * auVar74._12_4_;
        bVar51 = (bool)((byte)(uVar54 >> 4) & 1);
        auVar79._16_4_ = (uint)bVar51 * auVar69._16_4_ | (uint)!bVar51 * auVar74._16_4_;
        bVar51 = (bool)((byte)(uVar54 >> 5) & 1);
        auVar79._20_4_ = (uint)bVar51 * auVar69._20_4_ | (uint)!bVar51 * auVar74._20_4_;
        bVar51 = (bool)((byte)(uVar54 >> 6) & 1);
        auVar79._24_4_ = (uint)bVar51 * auVar69._24_4_ | (uint)!bVar51 * auVar74._24_4_;
        bVar51 = SUB81(uVar54 >> 7,0);
        auVar79._28_4_ = (uint)bVar51 * auVar69._28_4_ | (uint)!bVar51 * auVar74._28_4_;
        bVar51 = (bool)((byte)uVar17 & 1);
        auVar80._0_4_ = (float)((uint)bVar51 * auVar70._0_4_ | (uint)!bVar51 * auVar72._0_4_);
        bVar51 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar80._4_4_ = (float)((uint)bVar51 * auVar70._4_4_ | (uint)!bVar51 * auVar72._4_4_);
        bVar51 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar80._8_4_ = (float)((uint)bVar51 * auVar70._8_4_ | (uint)!bVar51 * auVar72._8_4_);
        bVar51 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar80._12_4_ = (float)((uint)bVar51 * auVar70._12_4_ | (uint)!bVar51 * auVar72._12_4_);
        bVar51 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar80._16_4_ = (float)((uint)bVar51 * auVar70._16_4_ | (uint)!bVar51 * auVar72._16_4_);
        bVar51 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar80._20_4_ = (float)((uint)bVar51 * auVar70._20_4_ | (uint)!bVar51 * auVar72._20_4_);
        bVar51 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar80._24_4_ = (float)((uint)bVar51 * auVar70._24_4_ | (uint)!bVar51 * auVar72._24_4_);
        bVar51 = SUB81(uVar17 >> 7,0);
        auVar80._28_4_ = (uint)bVar51 * auVar70._28_4_ | (uint)!bVar51 * auVar72._28_4_;
        auVar76._4_4_ = fVar10 * auVar80._4_4_;
        auVar76._0_4_ = fVar9 * auVar80._0_4_;
        auVar76._8_4_ = fVar11 * auVar80._8_4_;
        auVar76._12_4_ = fVar12 * auVar80._12_4_;
        auVar76._16_4_ = fVar13 * auVar80._16_4_;
        auVar76._20_4_ = fVar14 * auVar80._20_4_;
        auVar76._24_4_ = fVar15 * auVar80._24_4_;
        auVar76._28_4_ = auVar60._28_4_;
        auVar84 = vfmadd213ps_fma(auVar59,auVar79,auVar76);
        auVar84 = vfmadd213ps_fma(auVar58,auVar77,ZEXT1632(auVar84));
        auVar60 = ZEXT1632(CONCAT412(auVar84._12_4_ + auVar84._12_4_,
                                     CONCAT48(auVar84._8_4_ + auVar84._8_4_,
                                              CONCAT44(auVar84._4_4_ + auVar84._4_4_,
                                                       auVar84._0_4_ + auVar84._0_4_))));
        auVar81._0_4_ = auVar65._0_4_ * auVar80._0_4_;
        auVar81._4_4_ = auVar65._4_4_ * auVar80._4_4_;
        auVar81._8_4_ = auVar65._8_4_ * auVar80._8_4_;
        auVar81._12_4_ = auVar65._12_4_ * auVar80._12_4_;
        auVar81._16_4_ = auVar65._16_4_ * auVar80._16_4_;
        auVar81._20_4_ = auVar65._20_4_ * auVar80._20_4_;
        auVar81._24_4_ = auVar65._24_4_ * auVar80._24_4_;
        auVar81._28_4_ = 0;
        auVar84 = vfmadd213ps_fma(auVar62,auVar79,auVar81);
        auVar22 = vfmadd213ps_fma(auVar61,auVar77,ZEXT1632(auVar84));
        auVar56 = vrcp14ps_avx512vl(auVar60);
        auVar58 = vxorps_avx512vl(auVar60,auVar78);
        auVar59 = vfnmadd213ps_avx512vl(auVar56,auVar60,auVar55);
        auVar84 = vfmadd132ps_fma(auVar59,auVar56,auVar56);
        auVar56 = ZEXT1632(CONCAT412((auVar22._12_4_ + auVar22._12_4_) * auVar84._12_4_,
                                     CONCAT48((auVar22._8_4_ + auVar22._8_4_) * auVar84._8_4_,
                                              CONCAT44((auVar22._4_4_ + auVar22._4_4_) *
                                                       auVar84._4_4_,
                                                       (auVar22._0_4_ + auVar22._0_4_) *
                                                       auVar84._0_4_))));
        uVar19 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar20 = vcmpps_avx512vl(auVar56,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar21 = vcmpps_avx512vl(auVar60,auVar58,4);
        bVar43 = bVar43 & (byte)uVar19 & (byte)uVar20 & (byte)uVar21;
        if (bVar43 != 0) {
          local_2820 = auVar80;
          local_2800 = auVar79;
          local_27e0 = auVar77;
          local_27c0 = auVar56;
          local_27a0 = auVar57;
          _local_2780 = auVar64;
          _local_2760 = auVar63;
        }
      }
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar94 = ZEXT3264(auVar56);
      local_2ab8 = (local_2aa0->scene->geometries).items[uVar42].ptr;
      uVar48 = local_2ab8->mask;
      auVar83._4_4_ = uVar48;
      auVar83._0_4_ = uVar48;
      auVar83._8_4_ = uVar48;
      auVar83._12_4_ = uVar48;
      auVar83._16_4_ = uVar48;
      auVar83._20_4_ = uVar48;
      auVar83._24_4_ = uVar48;
      auVar83._28_4_ = uVar48;
      uVar19 = vptestmd_avx512vl(auVar83,*(undefined1 (*) [32])(ray + 0x120));
      bVar43 = (byte)uVar19 & bVar43;
      uVar42 = (ulong)bVar43;
      if (bVar43 != 0) {
        if ((local_2aa0->args->filter == (RTCFilterFunctionN)0x0) &&
           (local_2ab8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar53 = local_2a80._0_8_;
        }
        else {
          vandps_avx512vl(local_27a0,auVar68);
          uVar53 = vcmpps_avx512vl(auVar56,auVar97._0_32_,5);
          auVar56 = vrcp14ps_avx512vl(local_27a0);
          auVar57 = vfnmadd213ps_avx512vl(auVar56,local_27a0,auVar55);
          auVar57 = vfmadd132ps_avx512vl(auVar57,auVar56,auVar56);
          fVar9 = (float)((uint)((byte)uVar53 & 1) * auVar57._0_4_);
          fVar15 = (float)((uint)((byte)(uVar53 >> 1) & 1) * auVar57._4_4_);
          fVar14 = (float)((uint)((byte)(uVar53 >> 2) & 1) * auVar57._8_4_);
          fVar13 = (float)((uint)((byte)(uVar53 >> 3) & 1) * auVar57._12_4_);
          fVar12 = (float)((uint)((byte)(uVar53 >> 4) & 1) * auVar57._16_4_);
          fVar11 = (float)((uint)((byte)(uVar53 >> 5) & 1) * auVar57._20_4_);
          fVar10 = (float)((uint)((byte)(uVar53 >> 6) & 1) * auVar57._24_4_);
          auVar34._4_4_ = fVar15 * (float)local_2760._4_4_;
          auVar34._0_4_ = fVar9 * (float)local_2760._0_4_;
          auVar34._8_4_ = fVar14 * fStack_2758;
          auVar34._12_4_ = fVar13 * fStack_2754;
          auVar34._16_4_ = fVar12 * fStack_2750;
          auVar34._20_4_ = fVar11 * fStack_274c;
          auVar34._24_4_ = fVar10 * fStack_2748;
          auVar34._28_4_ = auVar56._28_4_;
          local_26e0 = vminps_avx512vl(auVar34,auVar55);
          auVar35._4_4_ = fVar15 * (float)local_2780._4_4_;
          auVar35._0_4_ = fVar9 * (float)local_2780._0_4_;
          auVar35._8_4_ = fVar14 * fStack_2778;
          auVar35._12_4_ = fVar13 * fStack_2774;
          auVar35._16_4_ = fVar12 * fStack_2770;
          auVar35._20_4_ = fVar11 * fStack_276c;
          auVar35._24_4_ = fVar10 * fStack_2768;
          auVar35._28_4_ = (uint)(byte)(uVar53 >> 7) * auVar57._28_4_;
          local_26c0 = vminps_avx512vl(auVar35,auVar55);
          local_2680 = vpbroadcastd_avx512vl();
          local_26a0 = vpbroadcastd_avx512vl();
          local_2740 = local_27e0._0_8_;
          uStack_2738 = local_27e0._8_8_;
          uStack_2730 = local_27e0._16_8_;
          uStack_2728 = local_27e0._24_8_;
          local_2720 = local_2800._0_8_;
          uStack_2718 = local_2800._8_8_;
          uStack_2710 = local_2800._16_8_;
          uStack_2708 = local_2800._24_8_;
          local_2700 = local_2820;
          vpcmpeqd_avx2(local_26e0,local_26e0);
          uStack_265c = local_2aa0->user->instID[0];
          local_2660 = uStack_265c;
          uStack_2658 = uStack_265c;
          uStack_2654 = uStack_265c;
          uStack_2650 = uStack_265c;
          uStack_264c = uStack_265c;
          uStack_2648 = uStack_265c;
          uStack_2644 = uStack_265c;
          uStack_263c = local_2aa0->user->instPrimID[0];
          local_2640 = uStack_263c;
          uStack_2638 = uStack_263c;
          uStack_2634 = uStack_263c;
          uStack_2630 = uStack_263c;
          uStack_262c = uStack_263c;
          uStack_2628 = uStack_263c;
          uStack_2624 = uStack_263c;
          local_2a00 = *(undefined1 (*) [32])(ray + 0x100);
          auVar55 = vblendmps_avx512vl(local_2a00,local_27c0);
          bVar51 = (bool)(bVar43 >> 1 & 1);
          bVar2 = (bool)(bVar43 >> 2 & 1);
          bVar3 = (bool)(bVar43 >> 3 & 1);
          bVar4 = (bool)(bVar43 >> 4 & 1);
          bVar5 = (bool)(bVar43 >> 5 & 1);
          bVar6 = (bool)(bVar43 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar43 & 1) * auVar55._0_4_ | !(bool)(bVar43 & 1) * uStack_263c;
          *(uint *)(ray + 0x104) = (uint)bVar51 * auVar55._4_4_ | !bVar51 * uStack_263c;
          *(uint *)(ray + 0x108) = (uint)bVar2 * auVar55._8_4_ | !bVar2 * uStack_263c;
          *(uint *)(ray + 0x10c) = (uint)bVar3 * auVar55._12_4_ | !bVar3 * uStack_263c;
          *(uint *)(ray + 0x110) = (uint)bVar4 * auVar55._16_4_ | !bVar4 * uStack_263c;
          *(uint *)(ray + 0x114) = (uint)bVar5 * auVar55._20_4_ | !bVar5 * uStack_263c;
          *(uint *)(ray + 0x118) = (uint)bVar6 * auVar55._24_4_ | !bVar6 * uStack_263c;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar43 >> 7) * auVar55._28_4_ | !(bool)(bVar43 >> 7) * uStack_263c;
          local_2a20 = vpmovm2d_avx512vl((ulong)bVar43);
          local_2a50.valid = (int *)local_2a20;
          local_2a50.geometryUserPtr = local_2ab8->userPtr;
          local_2a50.context = local_2aa0->user;
          local_2a50.hit = (RTCHitN *)&local_2740;
          local_2a50.N = 8;
          local_2a50.ray = (RTCRayN *)ray;
          if (local_2ab8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            in_ZMM13 = ZEXT1664(auVar64._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            (*local_2ab8->occlusionFilterN)(&local_2a50);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar94 = ZEXT3264(auVar55);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar101 = ZEXT3264(auVar55);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar100 = ZEXT3264(auVar55);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar99 = ZEXT3264(auVar55);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar98 = ZEXT3264(auVar55);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
            auVar97 = ZEXT3264(auVar55);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar96 = ZEXT3264(auVar55);
          }
          uVar42 = vptestmd_avx512vl(local_2a20,local_2a20);
          uVar53 = local_2a80._0_8_;
          if ((char)uVar42 != '\0') {
            p_Var1 = local_2aa0->args->filter;
            if ((p_Var1 != (RTCFilterFunctionN)0x0) &&
               (((local_2aa0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_2ab8->field_8).field_0x2 & 0x40) != 0))))
            {
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              (*p_Var1)(&local_2a50);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar94 = ZEXT3264(auVar55);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar101 = ZEXT3264(auVar55);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar100 = ZEXT3264(auVar55);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar99 = ZEXT3264(auVar55);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar98 = ZEXT3264(auVar55);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar97 = ZEXT3264(auVar55);
              auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar96 = ZEXT3264(auVar55);
            }
            uVar42 = vptestmd_avx512vl(local_2a20,local_2a20);
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar51 = (bool)((byte)uVar42 & 1);
            bVar2 = (bool)((byte)(uVar42 >> 1) & 1);
            bVar3 = (bool)((byte)(uVar42 >> 2) & 1);
            bVar4 = (bool)((byte)(uVar42 >> 3) & 1);
            bVar5 = (bool)((byte)(uVar42 >> 4) & 1);
            bVar6 = (bool)((byte)(uVar42 >> 5) & 1);
            bVar7 = (bool)((byte)(uVar42 >> 6) & 1);
            bVar8 = SUB81(uVar42 >> 7,0);
            *(uint *)(local_2a50.ray + 0x100) =
                 (uint)bVar51 * auVar55._0_4_ | (uint)!bVar51 * *(int *)(local_2a50.ray + 0x100);
            *(uint *)(local_2a50.ray + 0x104) =
                 (uint)bVar2 * auVar55._4_4_ | (uint)!bVar2 * *(int *)(local_2a50.ray + 0x104);
            *(uint *)(local_2a50.ray + 0x108) =
                 (uint)bVar3 * auVar55._8_4_ | (uint)!bVar3 * *(int *)(local_2a50.ray + 0x108);
            *(uint *)(local_2a50.ray + 0x10c) =
                 (uint)bVar4 * auVar55._12_4_ | (uint)!bVar4 * *(int *)(local_2a50.ray + 0x10c);
            *(uint *)(local_2a50.ray + 0x110) =
                 (uint)bVar5 * auVar55._16_4_ | (uint)!bVar5 * *(int *)(local_2a50.ray + 0x110);
            *(uint *)(local_2a50.ray + 0x114) =
                 (uint)bVar6 * auVar55._20_4_ | (uint)!bVar6 * *(int *)(local_2a50.ray + 0x114);
            *(uint *)(local_2a50.ray + 0x118) =
                 (uint)bVar7 * auVar55._24_4_ | (uint)!bVar7 * *(int *)(local_2a50.ray + 0x118);
            *(uint *)(local_2a50.ray + 0x11c) =
                 (uint)bVar8 * auVar55._28_4_ | (uint)!bVar8 * *(int *)(local_2a50.ray + 0x11c);
            uVar53 = local_2a80._0_8_;
          }
          bVar51 = (bool)((byte)uVar42 & 1);
          auVar82._0_4_ = (uint)bVar51 * *(int *)local_2a90 | (uint)!bVar51 * local_2a00._0_4_;
          bVar51 = (bool)((byte)(uVar42 >> 1) & 1);
          auVar82._4_4_ = (uint)bVar51 * *(int *)(local_2a90 + 4) | (uint)!bVar51 * local_2a00._4_4_
          ;
          bVar51 = (bool)((byte)(uVar42 >> 2) & 1);
          auVar82._8_4_ = (uint)bVar51 * *(int *)(local_2a90 + 8) | (uint)!bVar51 * local_2a00._8_4_
          ;
          bVar51 = (bool)((byte)(uVar42 >> 3) & 1);
          auVar82._12_4_ =
               (uint)bVar51 * *(int *)(local_2a90 + 0xc) | (uint)!bVar51 * local_2a00._12_4_;
          bVar51 = (bool)((byte)(uVar42 >> 4) & 1);
          auVar82._16_4_ =
               (uint)bVar51 * *(int *)(local_2a90 + 0x10) | (uint)!bVar51 * local_2a00._16_4_;
          bVar51 = (bool)((byte)(uVar42 >> 5) & 1);
          auVar82._20_4_ =
               (uint)bVar51 * *(int *)(local_2a90 + 0x14) | (uint)!bVar51 * local_2a00._20_4_;
          bVar51 = (bool)((byte)(uVar42 >> 6) & 1);
          auVar82._24_4_ =
               (uint)bVar51 * *(int *)(local_2a90 + 0x18) | (uint)!bVar51 * local_2a00._24_4_;
          bVar51 = SUB81(uVar42 >> 7,0);
          auVar82._28_4_ =
               (uint)bVar51 * *(int *)(local_2a90 + 0x1c) | (uint)!bVar51 * local_2a00._28_4_;
          *(undefined1 (*) [32])local_2a90 = auVar82;
        }
        bVar40 = (byte)local_2a98 & ~(byte)uVar42;
      }
      if ((bVar40 == 0) || (bVar51 = 2 < uVar45, uVar45 = uVar45 + 1, bVar51)) break;
    }
    bVar39 = bVar39 & bVar40;
    if (bVar39 == 0) break;
  }
  bVar39 = ~bVar39;
LAB_007a68e8:
  bVar47 = bVar47 | bVar39;
  uVar53 = local_2a88;
  if (bVar47 == 0xff) {
LAB_007a6916:
    iVar41 = 3;
  }
  else {
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    bVar51 = (bool)(bVar47 >> 1 & 1);
    bVar2 = (bool)(bVar47 >> 2 & 1);
    bVar3 = (bool)(bVar47 >> 3 & 1);
    bVar4 = (bool)(bVar47 >> 4 & 1);
    bVar5 = (bool)(bVar47 >> 5 & 1);
    bVar6 = (bool)(bVar47 >> 6 & 1);
    local_2840._4_4_ = (uint)bVar51 * auVar55._4_4_ | (uint)!bVar51 * local_2840._4_4_;
    local_2840._0_4_ =
         (uint)(bVar47 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar47 & 1) * local_2840._0_4_;
    local_2840._8_4_ = (uint)bVar2 * auVar55._8_4_ | (uint)!bVar2 * local_2840._8_4_;
    local_2840._12_4_ = (uint)bVar3 * auVar55._12_4_ | (uint)!bVar3 * local_2840._12_4_;
    local_2840._16_4_ = (uint)bVar4 * auVar55._16_4_ | (uint)!bVar4 * local_2840._16_4_;
    local_2840._20_4_ = (uint)bVar5 * auVar55._20_4_ | (uint)!bVar5 * local_2840._20_4_;
    local_2840._24_4_ = (uint)bVar6 * auVar55._24_4_ | (uint)!bVar6 * local_2840._24_4_;
    local_2840._28_4_ =
         (uint)(bVar47 >> 7) * auVar55._28_4_ | (uint)!(bool)(bVar47 >> 7) * local_2840._28_4_;
    iVar41 = 0;
  }
LAB_007a6919:
  if (iVar41 == 3) {
    bVar47 = bVar47 & bVar52;
    bVar51 = (bool)(bVar47 >> 1 & 1);
    bVar2 = (bool)(bVar47 >> 2 & 1);
    bVar3 = (bool)(bVar47 >> 3 & 1);
    bVar4 = (bool)(bVar47 >> 4 & 1);
    bVar5 = (bool)(bVar47 >> 5 & 1);
    bVar6 = (bool)(bVar47 >> 6 & 1);
    *(uint *)local_2a90 =
         (uint)(bVar47 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar47 & 1) * *(int *)local_2a90;
    *(uint *)(local_2a90 + 4) =
         (uint)bVar51 * auVar99._4_4_ | (uint)!bVar51 * *(int *)(local_2a90 + 4);
    *(uint *)(local_2a90 + 8) =
         (uint)bVar2 * auVar99._8_4_ | (uint)!bVar2 * *(int *)(local_2a90 + 8);
    *(uint *)(local_2a90 + 0xc) =
         (uint)bVar3 * auVar99._12_4_ | (uint)!bVar3 * *(int *)(local_2a90 + 0xc);
    *(uint *)(local_2a90 + 0x10) =
         (uint)bVar4 * auVar99._16_4_ | (uint)!bVar4 * *(int *)(local_2a90 + 0x10);
    *(uint *)(local_2a90 + 0x14) =
         (uint)bVar5 * auVar99._20_4_ | (uint)!bVar5 * *(int *)(local_2a90 + 0x14);
    *(uint *)(local_2a90 + 0x18) =
         (uint)bVar6 * auVar99._24_4_ | (uint)!bVar6 * *(int *)(local_2a90 + 0x18);
    *(uint *)(local_2a90 + 0x1c) =
         (uint)(bVar47 >> 7) * auVar99._28_4_ |
         (uint)!(bool)(bVar47 >> 7) * *(int *)(local_2a90 + 0x1c);
    return;
  }
  goto LAB_007a5e9f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }